

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_JumpIfInTargetInventory
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  int iVar2;
  AActor *owner;
  AActor *self;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (DObject *)(param->field_0).field_1.a;
    self = (AActor *)AActor::RegistrationInfo.MyClass;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (bVar1) {
      owner = GC::ReadBarrier<AActor>((AActor **)&this[0xb].ObjectFlags);
      iVar2 = DoJumpIfInventory(owner,self,param,numparam,ret,numret);
      return iVar2;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x540,
                "int AF_A_JumpIfInTargetInventory(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfInventory(self->target, self, param, numparam, ret, numret);
}